

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_truncate(Pager *pPager,Pgno nPage)

{
  long lVar1;
  int iVar2;
  undefined1 *puVar3;
  uint in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  char *pTmp;
  int szPage;
  int rc;
  i64 newSize;
  i64 currentSize;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  void *__s;
  undefined4 in_stack_ffffffffffffffd0;
  int local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  if ((**(long **)(in_RDI + 0x48) != 0) &&
     ((3 < *(byte *)(in_RDI + 0x15) || (*(char *)(in_RDI + 0x15) == '\0')))) {
    iVar2 = (int)*(undefined8 *)(in_RDI + 200);
    local_28 = sqlite3OsFileSize((sqlite3_file *)
                                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                 (i64 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8
                                                ));
    puVar3 = (undefined1 *)((long)iVar2 * (ulong)in_ESI);
    if ((local_28 == 0) && (puVar3 != &DAT_aaaaaaaaaaaaaaaa)) {
      if ((long)puVar3 < -0x5555555555555556) {
        local_28 = sqlite3OsTruncate((sqlite3_file *)
                                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      }
      else if ((long)(&DAT_aaaaaaaaaaaaaaaa + iVar2) <= (long)puVar3) {
        __s = *(void **)(in_RDI + 0x118);
        memset(__s,0,(long)iVar2);
        sqlite3OsFileControlHint
                  ((sqlite3_file *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc,(void *)0x164f1b);
        local_28 = sqlite3OsWrite((sqlite3_file *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),__s,
                                  in_stack_ffffffffffffffc4,
                                  CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      }
      if (local_28 == 0) {
        *(uint *)(in_RDI + 0x28) = in_ESI;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

static int pager_truncate(Pager *pPager, Pgno nPage){
  int rc = SQLITE_OK;
  assert( pPager->eState!=PAGER_ERROR );
  assert( pPager->eState!=PAGER_READER );
  PAGERTRACE(("Truncate %d npage %u\n", PAGERID(pPager), nPage));


  if( isOpen(pPager->fd)
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
  ){
    i64 currentSize, newSize;
    int szPage = pPager->pageSize;
    assert( pPager->eLock==EXCLUSIVE_LOCK );
    /* TODO: Is it safe to use Pager.dbFileSize here? */
    rc = sqlite3OsFileSize(pPager->fd, &currentSize);
    newSize = szPage*(i64)nPage;
    if( rc==SQLITE_OK && currentSize!=newSize ){
      if( currentSize>newSize ){
        rc = sqlite3OsTruncate(pPager->fd, newSize);
      }else if( (currentSize+szPage)<=newSize ){
        char *pTmp = pPager->pTmpSpace;
        memset(pTmp, 0, szPage);
        testcase( (newSize-szPage) == currentSize );
        testcase( (newSize-szPage) >  currentSize );
        sqlite3OsFileControlHint(pPager->fd, SQLITE_FCNTL_SIZE_HINT, &newSize);
        rc = sqlite3OsWrite(pPager->fd, pTmp, szPage, newSize-szPage);
      }
      if( rc==SQLITE_OK ){
        pPager->dbFileSize = nPage;
      }
    }
  }
  return rc;
}